

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_sub(lua_State *L)

{
  char *pcVar1;
  lua_Integer lVar2;
  ulong uVar3;
  size_t len;
  ulong uVar4;
  size_t l;
  ulong local_20;
  
  pcVar1 = luaL_checklstring(L,1,&local_20);
  lVar2 = luaL_checkinteger(L,2);
  if (lVar2 < 0) {
    if (local_20 < (ulong)-lVar2) {
      lVar2 = 0;
    }
    else {
      lVar2 = lVar2 + local_20 + 1;
    }
  }
  uVar3 = luaL_optinteger(L,3,-1);
  if ((long)uVar3 < 0) {
    if (local_20 < -uVar3) {
      uVar3 = 0;
    }
    else {
      uVar3 = uVar3 + local_20 + 1;
    }
  }
  uVar4 = lVar2 + (ulong)(lVar2 == 0);
  if (uVar3 < local_20) {
    local_20 = uVar3;
  }
  if (local_20 < uVar4) {
    pcVar1 = "";
    len = 0;
  }
  else {
    pcVar1 = pcVar1 + (uVar4 - 1);
    len = (local_20 - uVar4) + 1;
  }
  lua_pushlstring(L,pcVar1,len);
  return 1;
}

Assistant:

static int str_sub (lua_State *L) {
  size_t l;
  const char *s = luaL_checklstring(L, 1, &l);
  size_t start = posrelat(luaL_checkinteger(L, 2), l);
  size_t end = posrelat(luaL_optinteger(L, 3, -1), l);
  if (start < 1) start = 1;
  if (end > l) end = l;
  if (start <= end)
    lua_pushlstring(L, s + start - 1, end - start + 1);
  else lua_pushliteral(L, "");
  return 1;
}